

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

void checkobject(global_State *g,GCObject *o,int maybedead,int listage)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  GCObject *pGVar7;
  GCObject *pGVar8;
  uint uVar9;
  GCObject *pGVar10;
  char *pcVar11;
  int i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  TValue *t;
  Value local_38;
  ushort local_30;
  
  bVar1 = o->marked;
  if (((g->currentwhite ^ 0x18) & bVar1) == 0) {
    if (((bVar1 & 0x18) == 0) && (g->gcstate == '\b')) {
      __assert_fail("g->gcstate != 8 || (((o)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x19e,"void checkobject(global_State *, GCObject *, int, int)");
    }
    if (g->gckind == '\x01') {
      uVar9 = bVar1 & 7;
      if ((int)uVar9 < listage) {
        __assert_fail("((o)->marked & 7) >= listage",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a0,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (1 < uVar9 && (bVar1 & 0x18) != 0) {
        __assert_fail("!(((o)->marked) & (((1<<(3)) | (1<<(4))))) || !(((o)->marked & 7) > 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a1,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (((((bVar1 & 0x20) == 0 && 1 < uVar9) && (uVar9 != 2)) && (uVar9 != 5)) && (o->tt != '\b'))
      {
        __assert_fail("(((o)->marked) & ((1<<(5)))) || ((o)->marked & 7) == 5 || ((o)->marked & 7) == 2 || o->tt == 8"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a7,"void checkobject(global_State *, GCObject *, int, int)");
      }
    }
    switch(o->tt) {
    case '\x04':
    case '\x14':
      if ((bVar1 & 0x38) == 0) {
        __assert_fail("!(!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x186,"void checkrefs(global_State *, GCObject *)");
      }
      break;
    case '\x05':
      bVar1 = o->field_0xb;
      pGVar7 = *(GCObject **)&o[2].tt;
      lVar14 = *(long *)&o[1].tt;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((h->metatable)->tt) & 0x0F) < (9+1)";
LAB_001301bd:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x103,"void checktable(global_State *, Table *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_001301bd;
        }
      }
      lVar13 = 0;
      for (uVar12 = 0; uVar12 < *(uint *)&o->field_0xc; uVar12 = uVar12 + 1) {
        checkvalref(g,o,(TValue *)((long)&(o[1].next)->next + lVar13));
        lVar13 = lVar13 + 0x10;
      }
      for (t = (TValue *)(*(long *)&o[1].tt + 0x10);
          t + -1 < (TValue *)((long)(1 << (bVar1 & 0x1f)) * 0x20 + lVar14); t = t + 2) {
        if (t[-1].tt_ != 0) {
          if (t->tt_ == 0) {
            __assert_fail("!((((((const TValue*)((&(n)->i_key.tvk)))))->tt_) == (0))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x108,"void checktable(global_State *, Table *)");
          }
          checkvalref(g,o,t);
          checkvalref(g,o,t + -1);
        }
      }
      break;
    case '\x06':
      pGVar7 = *(GCObject **)&o[1].tt;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((cl->p)->tt) & 0x0F) < (9+1)";
LAB_0013017f:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x13b,"void checkLclosure(global_State *, LClosure *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0013017f;
        }
      }
      for (uVar12 = 0; uVar12 < (byte)o->field_0xa; uVar12 = uVar12 + 1) {
        pGVar7 = (&o[2].next)[uVar12];
        if (pGVar7 != (GCObject *)0x0) {
          if (pGVar7->next == pGVar7 + 1) {
            checkvalref(g,o,(TValue *)pGVar7->next);
          }
          iVar4._0_1_ = pGVar7->tt;
          iVar4._1_1_ = pGVar7->marked;
          iVar4._2_2_ = *(undefined2 *)&pGVar7->field_0xa;
          if (iVar4 == 0) {
            __assert_fail("uv->refcount > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x141,"void checkLclosure(global_State *, LClosure *)");
          }
        }
      }
      break;
    case '\a':
      pGVar7 = o[1].next;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((mt)->tt) & 0x0F) < (9+1)";
LAB_001301dc:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x114,"void checkudata(global_State *, Udata *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_001301dc;
        }
      }
      local_38 = (Value)((Value *)(o + 2))->gc;
      local_30 = *(ushort *)&o->field_0xa;
      if (((short)local_30 < 0) &&
         (((local_30 & 0x7f) != (ushort)(local_38.gc)->tt ||
          ((g->mainthread != (lua_State *)0x0 &&
           (((local_38.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x115,"void checkudata(global_State *, Udata *)");
      }
      checkvalref(g,o,(TValue *)&local_38);
      break;
    case '\b':
      pGVar7 = *(GCObject **)&o[3].tt;
      if (pGVar7 == (GCObject *)0x0) {
        iVar6._0_1_ = o[0xb].tt;
        iVar6._1_1_ = o[0xb].marked;
        iVar6._2_2_ = *(undefined2 *)&o[0xb].field_0xa;
        if (((iVar6 != 0) || (o[4].next != (GCObject *)0x0)) || (o[2].next != (GCObject *)0x0)) {
          __assert_fail("L1->stacksize == 0 && L1->openupval == ((void*)0) && L1->ci == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x15c,"void checkstack(global_State *, lua_State *)");
        }
      }
      else {
        pGVar8 = o + 4;
        while (pGVar10 = pGVar8->next, pGVar10 != (GCObject *)0x0) {
          pGVar8 = pGVar10 + 1;
          if (pGVar10->next == pGVar8) {
            __assert_fail("((uv)->v != &(uv)->u.value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x160,"void checkstack(global_State *, lua_State *)");
          }
        }
        for (pGVar8 = o + 2; pGVar8 = pGVar8->next, pGVar8 != (GCObject *)0x0; pGVar8 = pGVar8 + 1)
        {
          if (o[3].next < *(GCObject **)&pGVar8->tt) {
            __assert_fail("ci->top <= L1->stack_last",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x162,"void checkstack(global_State *, lua_State *)");
          }
          if ((((ulong)pGVar8[4].next & 0x20000) != 0) &&
             (*(char *)((long)&pGVar8[4].next + 6) == '\0')) {
            if ((o->field_0xa == '\x01') && (o[2].next == pGVar8)) {
              pGVar10 = (GCObject *)((long)&pGVar7->next + *(long *)&pGVar8[3].tt);
            }
            else {
              pGVar10 = pGVar8->next;
            }
            sVar2._0_1_ = pGVar10->tt;
            sVar2._1_1_ = pGVar10->marked;
            if (sVar2 != -0x7ffa) {
              pcVar11 = "((((f))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_001300fe:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x14e,"int lua_checkpc(lua_State *, CallInfo *)");
            }
            if (pGVar10->next->tt != '\x06') {
              pcVar11 = "(((f)->value_).gc)->tt == ((6) | ((0) << 4))";
              goto LAB_001300fe;
            }
            lVar14 = *(long *)&pGVar10->next[1].tt;
            uVar12._0_1_ = pGVar8[2].tt;
            uVar12._1_1_ = pGVar8[2].marked;
            uVar12._2_6_ = *(undefined6 *)&pGVar8[2].field_0xa;
            uVar5 = *(ulong *)(lVar14 + 0x38);
            if ((uVar12 < uVar5) || (uVar5 + (long)*(int *)(lVar14 + 0x18) * 4 < uVar12)) {
              __assert_fail("lua_checkpc(L1, ci)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x163,"void checkstack(global_State *, lua_State *)");
            }
          }
        }
        for (; pGVar7 < o[3].next + 5; pGVar7 = pGVar7 + 1) {
          uVar3._0_1_ = pGVar7->tt;
          uVar3._1_1_ = pGVar7->marked;
          if (((short)uVar3 < 0) &&
             (((uVar3 & 0x7f) != (ushort)pGVar7->next->tt ||
              ((pGVar7->next->marked & (*(byte *)(*(long *)&o[1].tt + 0x54) ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x166,"void checkstack(global_State *, lua_State *)");
          }
        }
      }
      break;
    case '\t':
      pGVar7 = o[6].next;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((f->cache)->tt) & 0x0F) < (9+1)";
LAB_0013019e:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x120,"void checkproto(global_State *, Proto *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0013019e;
        }
      }
      pGVar7 = *(GCObject **)&o[6].tt;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((f->source)->tt) & 0x0F) < (9+1)";
LAB_00130204:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x121,"void checkproto(global_State *, Proto *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_00130204;
        }
      }
      lVar14 = 8;
      for (lVar13 = 0; lVar13 < *(int *)((long)&o[1].next + 4); lVar13 = lVar13 + 1) {
        if ((*(ushort *)((long)&(o[3].next)->next + lVar14) & 0xf) == 4) {
          pGVar7 = *(GCObject **)((long)o[3].next + lVar14 + -8);
          if ((pGVar7->tt & 0xf) != 4) {
            pcVar11 = "(((((f->k + i)->value_).gc)->tt) & 0x0F) == 4";
LAB_0013001c:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x124,"void checkproto(global_State *, Proto *)");
          }
          iVar6 = testobjref(g,o,pGVar7);
          if (iVar6 == 0) {
            pcVar11 = "0";
            goto LAB_0013001c;
          }
        }
        lVar14 = lVar14 + 0x10;
      }
      lVar13 = 0;
      for (lVar14 = 0; lVar14 < *(int *)&o[1].next; lVar14 = lVar14 + 1) {
        pGVar7 = *(GCObject **)(*(long *)&o[5].tt + lVar13);
        if (pGVar7 != (GCObject *)0x0) {
          if (9 < (pGVar7->tt & 0xe)) {
            pcVar11 = "(((f->upvalues[i].name)->tt) & 0x0F) < (9+1)";
LAB_0012ff85:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x127,"void checkproto(global_State *, Proto *)");
          }
          iVar6 = testobjref(g,o,pGVar7);
          if (iVar6 == 0) {
            pcVar11 = "0";
            goto LAB_0012ff85;
          }
        }
        lVar13 = lVar13 + 0x18;
      }
      for (lVar14 = 0; lVar14 < *(int *)&o[2].next; lVar14 = lVar14 + 1) {
        pGVar7 = (&(o[4].next)->next)[lVar14];
        if (pGVar7 != (GCObject *)0x0) {
          if (9 < (pGVar7->tt & 0xe)) {
            pcVar11 = "(((f->p[i])->tt) & 0x0F) < (9+1)";
LAB_0012ffcc:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x129,"void checkproto(global_State *, Proto *)");
          }
          iVar6 = testobjref(g,o,pGVar7);
          if (iVar6 == 0) {
            pcVar11 = "0";
            goto LAB_0012ffcc;
          }
        }
      }
      lVar13 = 0;
      for (lVar14 = 0; lVar14 < *(int *)((long)&o[2].next + 4); lVar14 = lVar14 + 1) {
        pGVar7 = *(GCObject **)((long)&(o[5].next)->next + lVar13);
        if (pGVar7 != (GCObject *)0x0) {
          if (9 < (pGVar7->tt & 0xe)) {
            pcVar11 = "(((f->locvars[i].varname)->tt) & 0x0F) < (9+1)";
LAB_0012fff4:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,299,"void checkproto(global_State *, Proto *)");
          }
          iVar6 = testobjref(g,o,pGVar7);
          if (iVar6 == 0) {
            pcVar11 = "0";
            goto LAB_0012fff4;
          }
        }
        lVar13 = lVar13 + 0x20;
      }
      break;
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
switchD_0012fa79_caseD_a:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x189,"void checkrefs(global_State *, GCObject *)");
    default:
      if (o->tt != '&') goto switchD_0012fa79_caseD_a;
      pGVar7 = o + 2;
      for (uVar12 = 0; uVar12 < (byte)o->field_0xa; uVar12 = uVar12 + 1) {
        checkvalref(g,o,(TValue *)pGVar7);
        pGVar7 = pGVar7 + 1;
      }
    }
  }
  else if (maybedead == 0) {
    __assert_fail("maybedead",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x19c,"void checkobject(global_State *, GCObject *, int, int)");
  }
  return;
}

Assistant:

static void checkobject (global_State *g, GCObject *o, int maybedead,
                         int listage) {
  if (isdead(g, o))
    lua_assert(maybedead);
  else {
    lua_assert(g->gcstate != GCSpause || iswhite(o));
    if (g->gckind == KGC_GEN) {  /* generational mode? */
      lua_assert(getage(o) >= listage);
      lua_assert(!iswhite(o) || !isold(o));
      if (isold(o)) {
        lua_assert(isblack(o) ||
        getage(o) == G_TOUCHED1 ||
        getage(o) == G_OLD0 ||
        o->tt == LUA_TTHREAD /* ||
        (o->tt == LUA_TUPVAL && upisopen(gco2upv(o)))*/);
      }
    }
    checkrefs(g, o);
  }
}